

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase63::run(TestCase63 *this)

{
  bool bVar1;
  Type *in_RDX;
  ArrayPtr<const_char> AVar2;
  AddFailureAdapter local_1d0;
  ArrayPtr<const_char> local_1b8;
  bool local_1a1;
  undefined1 auStack_1a0 [7];
  bool _kj_shouldLog;
  size_t local_198;
  Exception *local_180;
  Exception *ex;
  undefined1 local_170 [8];
  Maybe<kj::Exception> e;
  TestCase63 *this_local;
  
  e.ptr.field_1._336_8_ = this;
  runCatchingExceptions<kj::_::(anonymous_namespace)::TestCase63::run()::__0>
            ((Maybe<kj::Exception> *)local_170,(kj *)((long)&ex + 7),in_RDX);
  local_180 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_170);
  if (local_180 == (Exception *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x47);
    AddFailureAdapter::operator<<(&local_1d0,(char (*) [19])"Expected exception");
    AddFailureAdapter::~AddFailureAdapter(&local_1d0);
  }
  else {
    _auStack_1a0 = (ArrayPtr<const_char>)Exception::getDescription(local_180);
    bVar1 = kj::operator==("std::exception: foo",(StringPtr *)auStack_1a0);
    if (!bVar1) {
      local_1a1 = Debug::shouldLog(ERROR);
      while (local_1a1 != false) {
        AVar2 = (ArrayPtr<const_char>)Exception::getDescription(local_180);
        local_1b8 = AVar2;
        Debug::log<char_const(&)[67],char_const(&)[20],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
                   ,0x45,ERROR,
                   "\"failed: expected \" \"(\\\"std::exception: foo\\\") == (ex->getDescription())\", \"std::exception: foo\", ex->getDescription()"
                   ,(char (*) [67])
                    "failed: expected (\"std::exception: foo\") == (ex->getDescription())",
                   (char (*) [20])"std::exception: foo",(StringPtr *)&local_1b8);
        local_1a1 = false;
      }
    }
  }
  Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_170);
  return;
}

Assistant:

TEST(String, Nullptr) {
  EXPECT_EQ(String(nullptr), "");
  EXPECT_EQ(StringPtr(String(nullptr)).size(), 0u);
  EXPECT_EQ(StringPtr(String(nullptr))[0], '\0');
}